

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O0

void Game::tumbleTilesUpOnGameboard(GameBoard *gb)

{
  GameBoard *gb_local;
  
  anon_unknown_0::doTumbleTilesUpOnGameboard(gb);
  return;
}

Assistant:

void tumbleTilesUpOnGameboard(GameBoard &gb) {
  doTumbleTilesUpOnGameboard(gb);
}